

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDebugger.cpp
# Opt level: O2

void __thiscall moira::Guards::removeAt(Guards *this,u32 addr)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Guard *pGVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar5 = this->count;
  lVar6 = 0;
  lVar8 = 0;
  if (0 < lVar5) {
    lVar8 = lVar5;
  }
  for (lVar7 = 1; lVar7 - lVar8 != 1; lVar7 = lVar7 + 1) {
    if (*(u32 *)((long)&this->guards->addr + lVar6) == addr) goto LAB_0020b830;
    lVar6 = lVar6 + 0x18;
  }
LAB_0020b83c:
  (*this->_vptr_Guards[2])(this,(ulong)(lVar5 != 0));
  return;
LAB_0020b830:
  for (; lVar7 < lVar5; lVar7 = lVar7 + 1) {
    pGVar3 = this->guards;
    *(undefined8 *)((long)&pGVar3->skip + lVar6) = *(undefined8 *)((long)&pGVar3[1].skip + lVar6);
    puVar2 = (undefined8 *)((long)&pGVar3[1].addr + lVar6);
    uVar4 = puVar2[1];
    puVar1 = (undefined8 *)((long)&pGVar3->addr + lVar6);
    *puVar1 = *puVar2;
    puVar1[1] = uVar4;
    lVar5 = this->count;
    lVar6 = lVar6 + 0x18;
  }
  lVar5 = lVar5 + -1;
  this->count = lVar5;
  goto LAB_0020b83c;
}

Assistant:

void
Guards::removeAt(u32 addr)
{
    for (int i = 0; i < count; i++) {

        if (guards[i].addr == addr) {

            for (int j = i; j + 1 < count; j++) guards[j] = guards[j + 1];
            count--;
            break;
        }
    }
    setNeedsCheck(count != 0);
}